

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare::operator()
          (SymbolCompare *this,SymbolEntry *lhs,SymbolEntry *rhs)

{
  DescriptorIndex *index;
  pointer pEVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  String *pSVar5;
  String *pSVar6;
  ulong uVar7;
  size_type sVar8;
  size_type sVar9;
  bool bVar10;
  long lVar11;
  difference_type __diff;
  size_type sVar12;
  pointer local_90;
  pointer local_88;
  ulong local_80;
  string local_70;
  string local_50;
  
  index = this->index;
  pEVar1 = (index->all_values_).
           super__Vector_base<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar8 = pEVar1[lhs->data_offset].encoded_package._M_string_length;
  if (sVar8 == 0) {
    pSVar5 = &lhs->encoded_symbol;
    sVar8 = (lhs->encoded_symbol)._M_string_length;
    local_88 = (pointer)0x0;
    local_80 = 0;
  }
  else {
    pSVar5 = &pEVar1[lhs->data_offset].encoded_package;
    local_88 = (lhs->encoded_symbol)._M_dataplus._M_p;
    local_80 = (lhs->encoded_symbol)._M_string_length;
  }
  sVar12 = pEVar1[rhs->data_offset].encoded_package._M_string_length;
  if (sVar12 == 0) {
    pSVar6 = &rhs->encoded_symbol;
    sVar12 = (rhs->encoded_symbol)._M_string_length;
    sVar9 = 0;
    local_90 = (pointer)0x0;
  }
  else {
    pSVar6 = &pEVar1[rhs->data_offset].encoded_package;
    local_90 = (rhs->encoded_symbol)._M_dataplus._M_p;
    sVar9 = (rhs->encoded_symbol)._M_string_length;
  }
  uVar7 = sVar12;
  if (sVar8 < sVar12) {
    uVar7 = sVar8;
  }
  if (uVar7 == 0) {
    iVar3 = 0;
  }
  else {
    iVar3 = memcmp((pSVar5->_M_dataplus)._M_p,(pSVar6->_M_dataplus)._M_p,uVar7);
  }
  if (iVar3 == 0) {
    if (sVar8 != sVar12) {
      bVar2 = true;
      bVar10 = false;
      goto LAB_003f91a6;
    }
    uVar7 = sVar9;
    if (local_80 < sVar9) {
      uVar7 = local_80;
    }
    if (uVar7 == 0) {
      iVar3 = 0;
    }
    else {
      iVar3 = memcmp(local_88,local_90,uVar7);
    }
    if (iVar3 == 0) {
      lVar11 = -0x80000000;
      if (-0x80000000 < (long)(local_80 - sVar9)) {
        lVar11 = local_80 - sVar9;
      }
      if (0x7ffffffe < lVar11) {
        lVar11 = 0;
      }
      iVar3 = (int)lVar11;
    }
  }
  bVar10 = SUB41((uint)iVar3 >> 0x1f,0);
  bVar2 = false;
LAB_003f91a6:
  if (bVar2) {
    SymbolEntry::AsString_abi_cxx11_(&local_70,lhs,index);
    SymbolEntry::AsString_abi_cxx11_(&local_50,rhs,this->index);
    sVar8 = local_70._M_string_length;
    if (local_50._M_string_length < local_70._M_string_length) {
      sVar8 = local_50._M_string_length;
    }
    if (sVar8 == 0) {
      uVar7 = 0;
    }
    else {
      uVar4 = memcmp(local_70._M_dataplus._M_p,local_50._M_dataplus._M_p,sVar8);
      uVar7 = (ulong)uVar4;
    }
    if ((int)uVar7 == 0) {
      uVar7 = 0xffffffff80000000;
      if (-0x80000000 < (long)(local_70._M_string_length - local_50._M_string_length)) {
        uVar7 = local_70._M_string_length - local_50._M_string_length;
      }
      if (0x7ffffffe < (long)uVar7) {
        uVar7 = 0;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    bVar10 = (bool)((byte)(uVar7 >> 0x1f) & 1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar10;
}

Assistant:

bool operator()(const SymbolEntry& lhs, const SymbolEntry& rhs) const {
      auto lhs_parts = GetParts(lhs);
      auto rhs_parts = GetParts(rhs);

      // Fast path to avoid making the whole string for common cases.
      if (int res =
              lhs_parts.first.substr(0, rhs_parts.first.size())
                  .compare(rhs_parts.first.substr(0, lhs_parts.first.size()))) {
        // If the packages already differ, exit early.
        return res < 0;
      } else if (lhs_parts.first.size() == rhs_parts.first.size()) {
        return lhs_parts.second < rhs_parts.second;
      }
      return AsString(lhs) < AsString(rhs);
    }